

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testDefaultOptionalValueOnUnsupportedSpec(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  NeuralNetwork *pNVar6;
  NeuralNetworkLayer *this;
  Tensor *pTVar7;
  StackLayerParams *pSVar8;
  ostream *poVar9;
  string *psVar10;
  long lVar11;
  int iVar12;
  char *pcVar13;
  Model m;
  Result res;
  
  CoreML::Specification::Model::Model(&m);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input1");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pAVar5->datatype_ = 0x10020;
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,2);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input2");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pFVar4->isoptional_ = true;
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pAVar5->datatype_ = 0x20020;
  CoreML::Specification::ArrayFeatureType::set_intdefaultvalue(pAVar5,2);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,2);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"output");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pAVar5->datatype_ = 0x10020;
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,1);
  pNVar6 = CoreML::Specification::Model::mutable_neuralnetwork(&m);
  pNVar6->arrayinputshapemapping_ = 1;
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&pNVar6->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"input1");
  CoreML::Specification::NeuralNetworkLayer::add_output(this,"output");
  pTVar7 = google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::Add
                     (&this->inputtensor_);
  pTVar7->rank_ = 3;
  pSVar8 = CoreML::Specification::NeuralNetworkLayer::mutable_stack(this);
  pSVar8->axis_ = 2;
  m.specificationversion_ = 4;
  CoreML::Model::validate(&res,&m);
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x157);
    poVar9 = std::operator<<(poVar9,": error: ");
    pcVar13 = "!((res).good())";
  }
  else {
    psVar10 = CoreML::Result::message_abi_cxx11_(&res);
    iVar12 = 0;
    lVar11 = std::__cxx11::string::find((char *)psVar10,0x2962ef);
    if (lVar11 != -1) goto LAB_001486ec;
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x158);
    poVar9 = std::operator<<(poVar9,": error: ");
    pcVar13 = 
    "res.message().find(\"Default value for optional inputs is supported from specification 5 (iOS 14)\") != std::string::npos"
    ;
  }
  poVar9 = std::operator<<(poVar9,pcVar13);
  poVar9 = std::operator<<(poVar9," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar9);
  iVar12 = 1;
LAB_001486ec:
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m);
  return iVar12;
}

Assistant:

int testDefaultOptionalValueOnUnsupportedSpec() {

    Specification::Model m;

    auto *in1 = m.mutable_description()->add_input();
    in1->set_name("input1");
    auto *inShape1 = in1->mutable_type()->mutable_multiarraytype();
    inShape1->set_datatype(Specification::ArrayFeatureType::ArrayDataType::ArrayFeatureType_ArrayDataType_FLOAT32);

    inShape1->add_shape(3);
    inShape1->add_shape(5);
    inShape1->add_shape(2);

    auto *in2 = m.mutable_description()->add_input();
    in2->set_name("input2");
    auto type = in2->mutable_type();
    type->set_isoptional(true);
    auto arr = type->mutable_multiarraytype();
    arr->set_datatype(Specification::ArrayFeatureType::ArrayDataType::ArrayFeatureType_ArrayDataType_INT32);
    arr->set_intdefaultvalue(2);
    arr->add_shape(3);
    arr->add_shape(5);
    arr->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->set_datatype(Specification::ArrayFeatureType::ArrayDataType::ArrayFeatureType_ArrayDataType_FLOAT32);
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(1);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input1");
    layers->add_output("output");
    layers->add_inputtensor()->set_rank(3);

    auto *params = layers->mutable_stack();
    params->set_axis(2);

    m.set_specificationversion(4);
    // axis should be in range [-(rank + 1), rank + 1)
    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("Default value for optional inputs is supported from specification 5 (iOS 14)") != std::string::npos);

    return 0;
}